

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O0

int av1_get_pred_context_uni_comp_ref_p2(MACROBLOCKD *xd)

{
  int local_20;
  int pred_context;
  int gld_count;
  int last3_count;
  uint8_t *ref_counts;
  MACROBLOCKD *xd_local;
  
  if (xd->neighbors_ref_counts[3] == xd->neighbors_ref_counts[4]) {
    local_20 = 1;
  }
  else {
    local_20 = 2;
    if (xd->neighbors_ref_counts[3] < xd->neighbors_ref_counts[4]) {
      local_20 = 0;
    }
  }
  return local_20;
}

Assistant:

int av1_get_pred_context_uni_comp_ref_p2(const MACROBLOCKD *xd) {
  const uint8_t *const ref_counts = &xd->neighbors_ref_counts[0];

  // Count of LAST3
  const int last3_count = ref_counts[LAST3_FRAME];
  // Count of GOLDEN
  const int gld_count = ref_counts[GOLDEN_FRAME];

  const int pred_context =
      (last3_count == gld_count) ? 1 : ((last3_count < gld_count) ? 0 : 2);

  assert(pred_context >= 0 && pred_context < UNI_COMP_REF_CONTEXTS);
  return pred_context;
}